

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

double __thiscall
CBlockPolicyEstimator::estimateCombinedFee
          (CBlockPolicyEstimator *this,uint confTarget,double successThreshold,
          bool checkShorterHorizon,EstimationResult *result)

{
  uint uVar1;
  void *in_RCX;
  byte in_DL;
  uint in_ESI;
  long in_FS_OFFSET;
  double dVar2;
  double shortMax;
  double medMax;
  double estimate;
  EstimationResult tempResult;
  int in_stack_000001ac;
  TxConfirmStats *in_stack_ffffffffffffff08;
  double local_a8;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = -1.0;
  if (in_ESI != 0) {
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff08);
    uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
    if (in_ESI <= uVar1) {
      std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                 in_stack_ffffffffffffff08);
      uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
      if (uVar1 < in_ESI) {
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   in_stack_ffffffffffffff08);
        uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
        if (uVar1 < in_ESI) {
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          local_a8 = TxConfirmStats::EstimateMedianVal
                               ((TxConfirmStats *)tempResult.fail.totalConfirmed,in_stack_000001ac,
                                tempResult.fail.withinTarget,tempResult.fail.end,
                                tempResult.fail.start._4_4_,
                                (EstimationResult *)tempResult.pass.leftMempool);
        }
        else {
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          local_a8 = TxConfirmStats::EstimateMedianVal
                               ((TxConfirmStats *)tempResult.fail.totalConfirmed,in_stack_000001ac,
                                tempResult.fail.withinTarget,tempResult.fail.end,
                                tempResult.fail.start._4_4_,
                                (EstimationResult *)tempResult.pass.leftMempool);
        }
      }
      else {
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   in_stack_ffffffffffffff08);
        local_a8 = TxConfirmStats::EstimateMedianVal
                             ((TxConfirmStats *)tempResult.fail.totalConfirmed,in_stack_000001ac,
                              tempResult.fail.withinTarget,tempResult.fail.end,
                              tempResult.fail.start._4_4_,
                              (EstimationResult *)tempResult.pass.leftMempool);
      }
      if ((in_DL & 1) != 0) {
        EstimationResult::EstimationResult((EstimationResult *)in_stack_ffffffffffffff08);
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   in_stack_ffffffffffffff08);
        uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
        if (uVar1 < in_ESI) {
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
          dVar2 = TxConfirmStats::EstimateMedianVal
                            ((TxConfirmStats *)tempResult.fail.totalConfirmed,in_stack_000001ac,
                             tempResult.fail.withinTarget,tempResult.fail.end,
                             tempResult.fail.start._4_4_,
                             (EstimationResult *)tempResult.pass.leftMempool);
          if (((0.0 < dVar2) && (((local_a8 == -1.0 && (!NAN(local_a8))) || (dVar2 < local_a8)))) &&
             (local_a8 = dVar2, in_RCX != (void *)0x0)) {
            memcpy(in_RCX,local_78,0x6c);
          }
        }
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   in_stack_ffffffffffffff08);
        uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
        if (uVar1 < in_ESI) {
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                    ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                     in_stack_ffffffffffffff08);
          TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff08);
          dVar2 = TxConfirmStats::EstimateMedianVal
                            ((TxConfirmStats *)tempResult.fail.totalConfirmed,in_stack_000001ac,
                             tempResult.fail.withinTarget,tempResult.fail.end,
                             tempResult.fail.start._4_4_,
                             (EstimationResult *)tempResult.pass.leftMempool);
          if (((0.0 < dVar2) && (((local_a8 == -1.0 && (!NAN(local_a8))) || (dVar2 < local_a8)))) &&
             (local_a8 = dVar2, in_RCX != (void *)0x0)) {
            memcpy(in_RCX,local_78,0x6c);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a8;
}

Assistant:

double CBlockPolicyEstimator::estimateCombinedFee(unsigned int confTarget, double successThreshold, bool checkShorterHorizon, EstimationResult *result) const
{
    double estimate = -1;
    if (confTarget >= 1 && confTarget <= longStats->GetMaxConfirms()) {
        // Find estimate from shortest time horizon possible
        if (confTarget <= shortStats->GetMaxConfirms()) { // short horizon
            estimate = shortStats->EstimateMedianVal(confTarget, SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, result);
        }
        else if (confTarget <= feeStats->GetMaxConfirms()) { // medium horizon
            estimate = feeStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        else { // long horizon
            estimate = longStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        if (checkShorterHorizon) {
            EstimationResult tempResult;
            // If a lower confTarget from a more recent horizon returns a lower answer use it.
            if (confTarget > feeStats->GetMaxConfirms()) {
                double medMax = feeStats->EstimateMedianVal(feeStats->GetMaxConfirms(), SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, &tempResult);
                if (medMax > 0 && (estimate == -1 || medMax < estimate)) {
                    estimate = medMax;
                    if (result) *result = tempResult;
                }
            }
            if (confTarget > shortStats->GetMaxConfirms()) {
                double shortMax = shortStats->EstimateMedianVal(shortStats->GetMaxConfirms(), SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, &tempResult);
                if (shortMax > 0 && (estimate == -1 || shortMax < estimate)) {
                    estimate = shortMax;
                    if (result) *result = tempResult;
                }
            }
        }
    }
    return estimate;
}